

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_complib.c
# Opt level: O3

char * read_file(char *filename,char *error_message,size_t message_size)

{
  int iVar1;
  FILE *__stream;
  size_t sVar2;
  char *__ptr;
  char *__format;
  
  __stream = fopen(filename,"r");
  if (__stream == (FILE *)0x0) {
    snprintf(error_message,message_size,"Failed to open file %s",filename);
    return (char *)0x0;
  }
  iVar1 = fseek(__stream,0,2);
  if (iVar1 == 0) {
    sVar2 = ftell(__stream);
    iVar1 = fseek(__stream,0,0);
    if (iVar1 == 0) {
      __ptr = (char *)calloc(1,sVar2 + 10);
      if (__ptr != (char *)0x0) {
        sVar2 = fread(__ptr,1,sVar2,__stream);
        if (sVar2 == 0) {
          snprintf(error_message,message_size,"Failed to read file");
          fclose(__stream);
          free(__ptr);
          return (char *)0x0;
        }
        goto LAB_00157355;
      }
      __format = "out of memory";
    }
    else {
      __format = "Failed to seek to file beginning";
    }
  }
  else {
    __format = "Failed to seek to file end";
  }
  __ptr = (char *)0x0;
  snprintf(error_message,message_size,__format);
LAB_00157355:
  fclose(__stream);
  return __ptr;
}

Assistant:

const char* read_file(const char* filename, char* error_message, size_t message_size) {
  /* We need to use binary read on Windows to get file size correctly */
#ifdef _WIN32
  FILE* fp = fopen(filename, "rb");
#else
  FILE* fp = fopen(filename, "r");
#endif
  if (fp == NULL) {
    snprintf(error_message, message_size, "Failed to open file %s", filename);
    return NULL;
  }
  if (fseek(fp, 0, SEEK_END) != 0) {
    snprintf(error_message, message_size, "Failed to seek to file end");
    fclose(fp);
    return NULL;
  }
  long long len = ftell(fp);
  if (fseek(fp, 0, SEEK_SET) != 0) {
    snprintf(error_message, message_size, "Failed to seek to file beginning");
    fclose(fp);
    return NULL;
  }
  char* buffer = (char*)calloc(1, len + 10);
  if (!buffer) {
    snprintf(error_message, message_size, "out of memory");
    fclose(fp);
    return NULL;
  }
  size_t n = fread(buffer, 1, len, fp);
  if (n == 0) {
    snprintf(error_message, message_size, "Failed to read file");
    fclose(fp);
    free(buffer);
    return NULL;
  }
  fclose(fp);
  return buffer;
}